

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToARGB4444Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_argb4444,
                        YuvConstants *yuvconstants,int width)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *in_RCX;
  uint8_t *in_RDX;
  long in_RSI;
  uint8_t *in_R8;
  uint in_R9D;
  YuvConstants *unaff_retaddr;
  int x;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  uint8_t r0;
  uint8_t g0;
  uint8_t b0;
  int local_38;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  uint8_t v;
  uint8_t u;
  uint8_t y;
  
  for (local_38 = 0; v = (uint8_t)((ulong)in_RSI >> 0x28), u = (uint8_t)((ulong)in_RSI >> 0x30),
      y = (uint8_t)((ulong)in_RSI >> 0x38), local_38 < (int)(in_R9D - 1); local_38 = local_38 + 2) {
    libyuv::YuvPixel(y,u,v,in_RDX,(uint8_t *)in_RCX,in_R8,unaff_retaddr);
    libyuv::YuvPixel((uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                     (uint8_t)((ulong)in_RSI >> 0x28),in_RDX,(uint8_t *)in_RCX,in_R8,unaff_retaddr);
    uVar1 = (uint)local_2d;
    local_2d = (byte)((int)uVar1 >> 4);
    uVar2 = (uint)local_2e;
    local_2e = (byte)((int)uVar2 >> 4);
    uVar3 = (uint)local_2f;
    local_2f = (byte)((int)uVar3 >> 4);
    uVar4 = (uint)local_30;
    local_30 = (byte)((int)uVar4 >> 4);
    uVar5 = (uint)local_31;
    local_31 = (byte)((int)uVar5 >> 4);
    uVar6 = (uint)local_32;
    local_32 = (byte)((int)uVar6 >> 4);
    *in_RCX = (int)uVar1 >> 4 | ((int)uVar2 >> 4) << 4 | ((int)uVar3 >> 4) << 8 |
              ((int)uVar4 >> 4) << 0x10 | ((int)uVar5 >> 4) << 0x14 | ((int)uVar6 >> 4) << 0x18 |
              0xf000f000;
    in_RSI = in_RSI + 1;
    in_RDX = in_RDX + 1;
    in_RCX = in_RCX + 1;
  }
  if ((in_R9D & 1) != 0) {
    libyuv::YuvPixel(y,u,v,in_RDX,(uint8_t *)in_RCX,in_R8,unaff_retaddr);
    *(ushort *)in_RCX =
         (ushort)(byte)((int)(uint)local_2d >> 4) | (ushort)(byte)((int)(uint)local_2e >> 4) << 4 |
         (ushort)(byte)((int)(uint)local_2f >> 4) << 8 | 0xf000;
  }
  return;
}

Assistant:

void I422ToARGB4444Row_C(const uint8_t* src_y,
                         const uint8_t* src_u,
                         const uint8_t* src_v,
                         uint8_t* dst_argb4444,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 4;
    g0 = g0 >> 4;
    r0 = r0 >> 4;
    b1 = b1 >> 4;
    g1 = g1 >> 4;
    r1 = r1 >> 4;
    *(uint32_t*)(dst_argb4444) = b0 | (g0 << 4) | (r0 << 8) | (b1 << 16) |
                                 (g1 << 20) | (r1 << 24) | 0xf000f000;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_argb4444 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 4;
    g0 = g0 >> 4;
    r0 = r0 >> 4;
    *(uint16_t*)(dst_argb4444) = b0 | (g0 << 4) | (r0 << 8) | 0xf000;
  }
}